

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWriteVer.c
# Opt level: O3

int Wlc_ObjFaninBitNum(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int iVar7;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar6;
  
  uVar1 = pObj->nFanins;
  if ((long)(int)uVar1 < 1) {
    iVar2 = 0;
  }
  else {
    lVar3 = 0;
    iVar2 = 0;
    do {
      if ((2 < uVar1) || (paVar6 = &pObj->field_10, (*(uint *)pObj & 0x3f | 0x10) == 0x16)) {
        paVar6 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
      }
      lVar5 = (long)paVar6->Fanins[lVar3];
      if ((lVar5 < 1) || (p->nObjsAlloc <= paVar6->Fanins[lVar3])) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      iVar7 = p->pObjs[lVar5].End - p->pObjs[lVar5].Beg;
      iVar4 = -iVar7;
      if (0 < iVar7) {
        iVar4 = iVar7;
      }
      iVar2 = iVar2 + iVar4 + 1;
      lVar3 = lVar3 + 1;
    } while ((int)uVar1 != lVar3);
  }
  return iVar2;
}

Assistant:

int Wlc_ObjFaninBitNum( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    Wlc_Obj_t * pFanin;
    int i, Count = 0;
    Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
        Count += Wlc_ObjRange(pFanin);
    return Count;
}